

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManLutFanouts(Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,
                     Vec_Bit_t *vMarksCIO)

{
  int iVar1;
  int local_34;
  int iFanout;
  int i;
  Vec_Bit_t *vMarksCIO_local;
  Vec_Bit_t *vMarksNo_local;
  Vec_Int_t *vFanouts_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsLut2(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut2(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x10f,
                  "int Spl_ManLutFanouts(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Bit_t *)");
  }
  Vec_IntClear(vFanouts);
  for (local_34 = 0; iVar1 = Gia_ObjFanoutNumId(p,iObj), local_34 < iVar1; local_34 = local_34 + 1)
  {
    iVar1 = Gia_ObjFanoutId(p,iObj,local_34);
    Spl_ManLutFanouts_rec(p,iVar1,vFanouts,vMarksNo,vMarksCIO);
  }
  for (local_34 = 0; iVar1 = Vec_IntSize(vFanouts), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vFanouts,local_34);
    Vec_BitWriteEntry(vMarksCIO,iVar1,0);
  }
  iVar1 = Vec_IntSize(vFanouts);
  return iVar1;
}

Assistant:

int Spl_ManLutFanouts( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int i, iFanout;
    assert( Gia_ObjIsLut2(p, iObj) );
    Vec_IntClear( vFanouts );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
    // clean up
    Vec_IntForEachEntry( vFanouts, iFanout, i )
        Vec_BitWriteEntry( vMarksCIO, iFanout, 0 );
    return Vec_IntSize(vFanouts);
}